

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cpp
# Opt level: O1

char * __thiscall CommandLineArguments::help(CommandLineArguments *this)

{
  return 
  "Thanks for using CppUTest.\n\nOptions that do not run tests but query:\n  -h                - this wonderful help screen. Joy!\n  -lg               - print a list of group names, separated by spaces\n  -ln               - print a list of test names in the form of group.name, separated by spaces\n  -ll               - print a list of test names in the form of group.name.test_file_path.line\n\nOptions that change the output format:\n  -c                - colorize output, print green if OK, or red if failed\n  -v                - verbose, print each test name as it runs\n  -vv               - very verbose, print internal information during test run\n\nOptions that change the output location:\n  -onormal          - no output to files\n  -oeclipse         - equivalent to -onormal\n  -oteamcity        - output to xml files (as the name suggests, for TeamCity)\n  -ojunit           - output to JUnit ant plugin style xml files (for CI systems)\n  -k <packageName>  - add a package name in JUnit output (for classification in CI systems)\n\n\nOptions that control which tests are run:\n  -g <group>        - only run tests whose group contains <group>\n  -n <name>         - only run tests whose name contains <name>\n  -t <group>.<name> - only run tests whose group and name contain <group> and <name>\n  -sg <group>       - only run tests whose group exactly matches <group>\n  -sn <name>        - only run tests whose name exactly matches <name>\n  -st <grp>.<name>  - only run tests whose group and name exactly match <grp> and <name>\n  -xg <group>       - exclude tests whose group contains <group>\n  -xn <name>        - exclude tests whose name contains <name>\n  -xt <grp>.<name>  - exclude tests whose group and name contain <grp> and <name>\n  -xsg <group>      - exclude tests whose group exactly matches <group>\n  -xsn <name>       - exclude tests whose name exactly matches <name>\n  -xst <grp>.<name> - exclude tests whose group and name exactly match <grp> and <name>\n  \"[IGNORE_]TEST(<group>, <name>)\"\n                    - only run tests whose group and name..." /* TRUNCATED STRING LITERAL */
  ;
}

Assistant:

const char* CommandLineArguments::help() const
{
    return
      "Thanks for using CppUTest.\n"
      "\n"
      "Options that do not run tests but query:\n"
      "  -h                - this wonderful help screen. Joy!\n"
      "  -lg               - print a list of group names, separated by spaces\n"
      "  -ln               - print a list of test names in the form of group.name, separated by spaces\n"
      "  -ll               - print a list of test names in the form of group.name.test_file_path.line\n"
      "\n"
      "Options that change the output format:\n"
      "  -c                - colorize output, print green if OK, or red if failed\n"
      "  -v                - verbose, print each test name as it runs\n"
      "  -vv               - very verbose, print internal information during test run\n"
      "\n"
      "Options that change the output location:\n"
      "  -onormal          - no output to files\n"
      "  -oeclipse         - equivalent to -onormal\n"
      "  -oteamcity        - output to xml files (as the name suggests, for TeamCity)\n"
      "  -ojunit           - output to JUnit ant plugin style xml files (for CI systems)\n"
      "  -k <packageName>  - add a package name in JUnit output (for classification in CI systems)\n"
      "\n"
      "\n"
      "Options that control which tests are run:\n"
      "  -g <group>        - only run tests whose group contains <group>\n"
      "  -n <name>         - only run tests whose name contains <name>\n"
      "  -t <group>.<name> - only run tests whose group and name contain <group> and <name>\n"
      "  -sg <group>       - only run tests whose group exactly matches <group>\n"
      "  -sn <name>        - only run tests whose name exactly matches <name>\n"
      "  -st <grp>.<name>  - only run tests whose group and name exactly match <grp> and <name>\n"
      "  -xg <group>       - exclude tests whose group contains <group>\n"
      "  -xn <name>        - exclude tests whose name contains <name>\n"
      "  -xt <grp>.<name>  - exclude tests whose group and name contain <grp> and <name>\n"
      "  -xsg <group>      - exclude tests whose group exactly matches <group>\n"
      "  -xsn <name>       - exclude tests whose name exactly matches <name>\n"
      "  -xst <grp>.<name> - exclude tests whose group and name exactly match <grp> and <name>\n"
      "  \"[IGNORE_]TEST(<group>, <name>)\"\n"
      "                    - only run tests whose group and name exactly match <group> and <name>\n"
      "                      (this can be used to copy-paste output from the -v option on the command line)\n"
      "\n"
      "Options that control how the tests are run:\n"
      "  -p                - run tests in a separate process\n"
      "  -b                - run the tests backwards, reversing the normal way\n"
      "  -s [<seed>]       - shuffle tests randomly (randomization seed is optional, must be greater than 0)\n"
      "  -r[<#>]           - repeat the tests <#> times (or twice if <#> is not specified)\n"
      "  -f                - Cause the tests to crash on failure (to allow the test to be debugged if necessary)\n"
      "  -e                - do not rethrow unexpected exceptions on failure\n"
      "  -ci               - continuous integration mode (equivalent to -e)\n";
}